

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::anon_unknown_0::SanitizeNameForObjC
                   (string *__return_storage_ptr__,string *prefix,string *input,string *extension,
                   string *out_suffix_added)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  string *num_words;
  string sanitized;
  StringPiece local_70;
  StringPiece local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  num_words = extension;
  if ((anonymous_namespace)::
      SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
      ::kReservedWords_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                                 ::kReservedWords_abi_cxx11_);
    if (iVar3 != 0) {
      (anonymous_namespace)::MakeWordsMap_abi_cxx11_
                (&(anonymous_namespace)::
                  SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                  ::kReservedWords_abi_cxx11_,
                 (_anonymous_namespace_ *)(anonymous_namespace)::kReservedWordList,(char **)0x95,
                 (size_t)num_words);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &(anonymous_namespace)::
                    SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                    ::kReservedWords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                           ::kReservedWords_abi_cxx11_);
    }
  }
  if ((anonymous_namespace)::
      SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
      ::kNSObjectMethods_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                                 ::kNSObjectMethods_abi_cxx11_);
    if (iVar3 != 0) {
      (anonymous_namespace)::MakeWordsMap_abi_cxx11_
                (&(anonymous_namespace)::
                  SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                  ::kNSObjectMethods_abi_cxx11_,(_anonymous_namespace_ *)kNSObjectMethodsList,
                 (char **)0xb9,(size_t)num_words);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &(anonymous_namespace)::
                    SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                    ::kNSObjectMethods_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                           ::kNSObjectMethods_abi_cxx11_);
    }
  }
  paVar1 = &sanitized.field_2;
  sanitized._M_string_length = 0;
  sanitized.field_2._M_local_buf[0] = '\0';
  sanitized._M_dataplus._M_p = (pointer)paVar1;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_60,input);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_70,prefix);
  bVar2 = HasPrefixString(local_60,local_70);
  if (bVar2) {
    if ((input->_M_string_length == prefix->_M_string_length) ||
       (0x19 < (byte)((input->_M_dataplus)._M_p[prefix->_M_string_length] + 0xbfU))) {
      std::operator+(&local_50,prefix,input);
      goto LAB_002ad66a;
    }
    std::__cxx11::string::_M_assign((string *)&sanitized);
  }
  else {
    std::operator+(&local_50,prefix,input);
LAB_002ad66a:
    std::__cxx11::string::operator=((string *)&sanitized,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (sanitized._M_string_length < 3) {
LAB_002ad6c8:
    sVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&(anonymous_namespace)::
                     SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                     ::kReservedWords_abi_cxx11_._M_h,&sanitized);
    if (sVar5 == 0) {
      sVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(&(anonymous_namespace)::
                       SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                       ::kNSObjectMethods_abi_cxx11_._M_h,&sanitized);
      if (sVar5 == 0) {
        if (out_suffix_added != (string *)0x0) {
          out_suffix_added->_M_string_length = 0;
          *(out_suffix_added->_M_dataplus)._M_p = '\0';
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sanitized._M_dataplus._M_p == paVar1) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(sanitized.field_2._M_allocated_capacity._1_7_,
                        sanitized.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = sanitized.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = sanitized._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(sanitized.field_2._M_allocated_capacity._1_7_,
                        sanitized.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = sanitized._M_string_length;
        sanitized._M_string_length = 0;
        sanitized.field_2._M_local_buf[0] = '\0';
        sanitized._M_dataplus._M_p = (pointer)paVar1;
        goto LAB_002ad714;
      }
    }
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::at((ulong)&sanitized);
    if (*pcVar4 != '_') goto LAB_002ad6c8;
    pcVar4 = (char *)std::__cxx11::string::at((ulong)&sanitized);
    iVar3 = isupper((int)*pcVar4);
    if (iVar3 == 0) {
      pcVar4 = (char *)std::__cxx11::string::at((ulong)&sanitized);
      if (*pcVar4 != '_') goto LAB_002ad6c8;
    }
  }
  if (out_suffix_added != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)out_suffix_added);
  }
  std::operator+(__return_storage_ptr__,&sanitized,extension);
LAB_002ad714:
  std::__cxx11::string::~string((string *)&sanitized);
  return __return_storage_ptr__;
}

Assistant:

std::string SanitizeNameForObjC(const std::string& prefix,
                           const std::string& input,
                           const std::string& extension,
                           std::string* out_suffix_added) {
  static const std::unordered_set<std::string> kReservedWords =
      MakeWordsMap(kReservedWordList, GOOGLE_ARRAYSIZE(kReservedWordList));
  static const std::unordered_set<std::string> kNSObjectMethods =
      MakeWordsMap(kNSObjectMethodsList, GOOGLE_ARRAYSIZE(kNSObjectMethodsList));
  std::string sanitized;
  // We add the prefix in the cases where the string is missing a prefix.
  // We define "missing a prefix" as where 'input':
  // a) Doesn't start with the prefix or
  // b) Isn't equivalent to the prefix or
  // c) Has the prefix, but the letter after the prefix is lowercase
  if (HasPrefixString(input, prefix)) {
    if (input.length() == prefix.length() || !ascii_isupper(input[prefix.length()])) {
      sanitized = prefix + input;
    } else {
      sanitized = input;
    }
  } else {
    sanitized = prefix + input;
  }
  if (IsReservedCIdentifier(sanitized) ||
      (kReservedWords.count(sanitized) > 0) ||
      (kNSObjectMethods.count(sanitized) > 0)) {
    if (out_suffix_added) *out_suffix_added = extension;
    return sanitized + extension;
  }
  if (out_suffix_added) out_suffix_added->clear();
  return sanitized;
}